

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  uint32 first_byte_or_zero;
  undefined4 extraout_var;
  FieldDescriptor *field;
  uint32 field_number;
  uint32 length;
  StringOutputStream output_stream;
  string message_data;
  CodedOutputStream coded_output;
  string temp;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  message_data._M_dataplus._M_p = (pointer)&message_data.field_2;
  message_data._M_string_length = 0;
  message_data.field_2._M_local_buf[0] = '\0';
  field_number = 0;
  field = (FieldDescriptor *)0x0;
LAB_0060bbca:
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_0060bbe8;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_0060bbe8:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
      input->last_tag_ = first_byte_or_zero;
    }
    if (first_byte_or_zero == 0x1a) {
      if (field_number == 0) {
        temp._M_dataplus._M_p = (pointer)&temp.field_2;
        temp._M_string_length = 0;
        temp.field_2._M_local_buf[0] = '\0';
        bVar3 = io::CodedInputStream::ReadVarint32(input,&length);
        if ((!bVar3) || (bVar3 = io::CodedInputStream::ReadString(input,&temp,length), !bVar3)) {
          std::__cxx11::string::~string((string *)&temp);
          goto LAB_0060bda2;
        }
        io::StringOutputStream::StringOutputStream(&output_stream,&message_data);
        io::CodedOutputStream::CodedOutputStream
                  (&coded_output,&output_stream.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32(&coded_output,length);
        io::CodedOutputStream::WriteString(&coded_output,&temp);
        io::CodedOutputStream::~CodedOutputStream(&coded_output);
        io::StringOutputStream::~StringOutputStream(&output_stream);
        std::__cxx11::string::~string((string *)&temp);
        field_number = 0;
        goto LAB_0060bbca;
      }
      bVar3 = ParseAndMergeMessageSetField(field_number,field,message,input);
    }
    else {
      if (first_byte_or_zero == 0) goto LAB_0060bda2;
      if (first_byte_or_zero == 0xc) {
        bVar3 = true;
        goto LAB_0060bda4;
      }
      if (first_byte_or_zero == 0x10) {
        bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&output_stream);
        field_number = (uint32)output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
        if (!bVar3) goto LAB_0060bda2;
        field = (FieldDescriptor *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x270))
                          ((long *)CONCAT44(extraout_var,iVar4),
                           (uint32)output_stream.super_ZeroCopyOutputStream.
                                   _vptr_ZeroCopyOutputStream);
        if (message_data._M_string_length != 0) {
          io::ArrayInputStream::ArrayInputStream
                    ((ArrayInputStream *)&coded_output,message_data._M_dataplus._M_p,
                     (int)message_data._M_string_length,-1);
          io::CodedInputStream::CodedInputStream
                    ((CodedInputStream *)&temp,(ZeroCopyInputStream *)&coded_output);
          bVar3 = ParseAndMergeMessageSetField(field_number,field,message,(CodedInputStream *)&temp)
          ;
          if (!bVar3) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
            io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_output);
            goto LAB_0060bda2;
          }
          message_data._M_string_length = 0;
          *message_data._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
          io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_output);
        }
        goto LAB_0060bbca;
      }
      bVar3 = SkipField(input,first_byte_or_zero,(UnknownFieldSet *)0x0);
    }
    if (bVar3 == false) {
LAB_0060bda2:
      bVar3 = false;
LAB_0060bda4:
      std::__cxx11::string::~string((string *)&message_data);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}